

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# riotUI.c
# Opt level: O3

void drawInmateSelection(Windows *win,Map *map,UnitList *inmates,UnitList *guards)

{
  char cVar1;
  int iVar2;
  Inmate *unit;
  char *pcVar3;
  int iVar4;
  InmateType IVar5;
  WINDOW *pWVar6;
  int iVar7;
  
  iVar4 = 0;
  do {
    updateHeader(win->header,map);
    wrefresh(win->header);
    cVar1 = wgetch(win->body);
    switch(cVar1) {
    case 'a':
      pWVar6 = win->footer;
      if (map->repMax < 0x1e) break;
      mvwprintw(pWVar6,0,0x28,"ATTORNEY ADDED");
      unit = createInmate(ATTORNEY);
      map->repMax = map->repMax + -0x1e;
LAB_001034f4:
      enqueue(inmates,unit);
      iVar4 = iVar4 + 1;
      updateQueue(win->body,inmates,iVar4);
      goto LAB_0010352c;
    case 'b':
      pWVar6 = win->footer;
      if (0xf < map->repMax) {
        mvwprintw(pWVar6,0,0x28,"BRUISER ADDED");
        IVar5 = BRUISER;
LAB_00103409:
        unit = createInmate(IVar5);
        map->repMax = map->repMax + -0x10;
        goto LAB_001034f4;
      }
      break;
    case 'c':
      pWVar6 = win->footer;
      if (0x13 < map->repMax) {
        mvwprintw(pWVar6,0,0x28,"CUTIE ADDED");
        unit = createInmate(CUTIE);
        map->repMax = map->repMax + -0x14;
        goto LAB_001034f4;
      }
      break;
    case 'd':
      pWVar6 = win->footer;
      if (9 < map->repMax) {
        mvwprintw(pWVar6,0,0x28,"DOCTOR ADDED");
        IVar5 = DOCTOR;
LAB_001034b0:
        unit = createInmate(IVar5);
        map->repMax = map->repMax + -10;
        goto LAB_001034f4;
      }
      break;
    default:
      pWVar6 = win->footer;
      pcVar3 = "INMATE NOT FOUND";
      goto LAB_00103525;
    case 'f':
      pWVar6 = win->footer;
      if (0x3b < map->repMax) {
        mvwprintw(pWVar6,0,0x28,"FATTY ADDED");
        unit = createInmate(FATTY);
        map->repMax = map->repMax + -0x3c;
        goto LAB_001034f4;
      }
      break;
    case 'h':
      pWVar6 = win->footer;
      if (9 < map->repMax) {
        mvwprintw(pWVar6,0,0x28,"HOMEBOY ADDED");
        map->repMax = map->repMax + -10;
        unit = createInmate(HOMEBOY);
        goto LAB_001034f4;
      }
      break;
    case 'l':
      pWVar6 = win->footer;
      if (0xf < map->repMax) {
        mvwprintw(pWVar6,0,0x28,"LUNATIC ADDED");
        IVar5 = LUNATIC;
        goto LAB_00103409;
      }
      break;
    case 's':
      if (9 < map->repMax) {
        mvwprintw(win->footer,0,0x28,"SPEEDY ADDED");
        IVar5 = SPEEDY;
        goto LAB_001034b0;
      }
      goto LAB_001035bf;
    }
    pcVar3 = "INSUFICIENT FUNDS";
LAB_00103525:
    mvwprintw(pWVar6,0,0x28,pcVar3);
LAB_0010352c:
    if (map->repMax < 10) {
LAB_001035bf:
      mvwprintw(win->footer,0,0x14,"INSUFICIENT FUNDS");
      wrefresh(win->footer);
      wgetch(win->body);
LAB_001035ea:
      iVar4 = 1;
      do {
        iVar7 = wmove(win->footer,0,iVar4);
        if (iVar7 != -1) {
          waddch(win->footer);
        }
        iVar4 = iVar4 + 1;
      } while (iVar4 != 0x4b);
      iVar4 = 1;
      do {
        iVar7 = wmove(win->body,0x10,iVar4);
        if (iVar7 != -1) {
          waddch(win->body,0x20);
        }
        iVar4 = iVar4 + 1;
      } while (iVar4 != 0x4b);
      wrefresh(win->footer);
      wrefresh(win->body);
      return;
    }
    if ((cVar1 == '\n') && (iVar4 == 0)) {
      mvwprintw(win->footer,0,0x1e,"Please select at least one unit");
      cVar1 = ' ';
    }
    else if (cVar1 == '\n') goto LAB_001035ea;
    wrefresh(win->footer);
    iVar7 = 0x1e;
    do {
      iVar2 = wmove(win->footer,0,iVar7);
      if (iVar2 != -1) {
        waddch(win->footer);
      }
      iVar7 = iVar7 + 1;
    } while (iVar7 != 0x4b);
    if ((cVar1 == '\n') || (4 < iVar4)) goto LAB_001035ea;
  } while( true );
}

Assistant:

void drawInmateSelection(struct Windows *win, struct Map *map,
    struct UnitList *inmates, struct UnitList *guards) {
    struct Inmate *inmate;
    char input;
    int y;
    int numAdded = 0;
//
//    mvwprintw(win->body, MAP_ROWS, 3,
//        "Press the corresponding letter to buy inmate");
//    mvwprintw(win->footer, 0, 3, "Press \"Enter\" to play:");
    do {
        updateHeader(win->header, map);
        wrefresh(win->header);
        input = wgetch(win->body);
        switch (input) {
            case 'h':
                if (map->repMax >= 10) {
                    mvwprintw(win->footer, 0, 40, "HOMEBOY ADDED");
                    map->repMax -= 10;
                    inmate = createInmate(input);
                    enqueue(inmates, inmate);
                    numAdded++;
                    updateQueue(win->body, inmates, numAdded);
                }
                else {
                    mvwprintw(win->footer, 0, 40, "INSUFICIENT FUNDS");
                }
                break;
            case 'b':
                if (map->repMax >= 16) {
                    mvwprintw(win->footer, 0, 40, "BRUISER ADDED");
                    inmate = createInmate(input);
                    map->repMax -= 16;
                    enqueue(inmates, inmate);
                    numAdded++;
                    updateQueue(win->body, inmates, numAdded);
                }
                else {
                    mvwprintw(win->footer, 0, 40, "INSUFICIENT FUNDS");
                }
                break;
            case 'l':
                if (map->repMax >= 16) {
                    mvwprintw(win->footer, 0, 40, "LUNATIC ADDED");
                    inmate = createInmate(input);
                    map->repMax -= 16;
                    enqueue(inmates, inmate);
                    numAdded++;
                    updateQueue(win->body, inmates, numAdded);
                }
                else {
                    mvwprintw(win->footer, 0, 40, "INSUFICIENT FUNDS");
                }
                break;
            case 'f':
                if (map->repMax >= 60) {
                    mvwprintw(win->footer, 0, 40, "FATTY ADDED");
                    inmate = createInmate(input);
                    map->repMax -= 60;
                    enqueue(inmates, inmate);
                    numAdded++;
                    updateQueue(win->body, inmates, numAdded);
                }
                else {
                    mvwprintw(win->footer, 0, 40, "INSUFICIENT FUNDS");
                }
                break;
            case 's':
                if (map->repMax >= 10) {
                    mvwprintw(win->footer, 0, 40, "SPEEDY ADDED");
                    inmate = createInmate(input);
                    map->repMax -= 10;
                    enqueue(inmates, inmate);
                    numAdded++;
                    updateQueue(win->body, inmates, numAdded);
                }
                break;
            case 'c':
                if (map->repMax >= 20) {
                    mvwprintw(win->footer, 0, 40, "CUTIE ADDED");
                    inmate = createInmate(input);
                    map->repMax -= 20;
                    enqueue(inmates, inmate);
                    numAdded++;
                    updateQueue(win->body, inmates, numAdded);
                }
                else {
                    mvwprintw(win->footer, 0, 40, "INSUFICIENT FUNDS");
                }
                break;
            case 'a':
                if (map->repMax >= 30) {
                    mvwprintw(win->footer, 0, 40, "ATTORNEY ADDED");
                    inmate = createInmate(input);
                    map->repMax -= 30;
                    enqueue(inmates, inmate);
                    numAdded++;
                    updateQueue(win->body, inmates, numAdded);
                }
                else {
                    mvwprintw(win->footer, 0, 40, "INSUFICIENT FUNDS");
                }
                break;
            case 'd':
                if (map->repMax >= 10) {
                    mvwprintw(win->footer, 0, 40, "DOCTOR ADDED");
                    inmate = createInmate(input);
                    map->repMax -= 10;
                    enqueue(inmates, inmate);
                    numAdded++;
                    updateQueue(win->body, inmates, numAdded);
                }
                else {
                    mvwprintw(win->footer, 0, 40, "INSUFICIENT FUNDS");
                }
                break;
            default:
                mvwprintw(win->footer, 0, 40, "INMATE NOT FOUND");
        }
        if (map->repMax < 10) {
            mvwprintw(win->footer, 0, 20, "INSUFICIENT FUNDS");
            wrefresh(win->footer);
            wgetch(win->body);
            break;
        }
        if (input == '\n' && numAdded == 0) {
            mvwprintw(win->footer, 0, 30, "Please select at least one unit");
            input = ' ';
        }
        else if (input == '\n') {
            break;
        }
        wrefresh(win->footer);
        for (y = 30; y < MAX_COLS - 5; y++) {
            mvwaddch(win->footer, 0, y, ACS_HLINE);
        }
    } while (input != '\n' && numAdded < 5);
    for (y = 1; y < MAX_COLS - 5; y++) {
        mvwaddch(win->footer, 0, y, ACS_HLINE);
    }
    for (y = 1; y < MAX_COLS - 5; y++) {
        mvwaddch(win->body, MAP_ROWS, y, ' ');
    }
    wrefresh(win->footer);
    wrefresh(win->body);
}